

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementFormControlTextArea.cpp
# Opt level: O1

void __thiscall
Rml::ElementFormControlTextArea::OnAttributeChange
          (ElementFormControlTextArea *this,ElementAttributes *changed_attributes)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  WidgetTextInput *pWVar2;
  const_iterator cVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  String local_48;
  int local_24;
  
  ElementFormControl::OnAttributeChange(&this->super_ElementFormControl,changed_attributes);
  cVar3 = itlib::
          flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
          ::find<char[5]>(changed_attributes,(char (*) [5])0x2df732);
  if (cVar3._M_current !=
      (changed_attributes->m_container).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    SetWordWrapProperties(this);
  }
  cVar3 = itlib::
          flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
          ::find<char[5]>(changed_attributes,(char (*) [5])"rows");
  if (cVar3._M_current ==
      (changed_attributes->m_container).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    cVar3 = itlib::
            flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
            ::find<char[5]>(changed_attributes,(char (*) [5])"cols");
    if (cVar3._M_current ==
        (changed_attributes->m_container).
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) goto LAB_002a4469;
  }
  (*(this->super_ElementFormControl).super_Element.super_ScriptInterface.super_Releasable.
    _vptr_Releasable[0x15])(this);
LAB_002a4469:
  cVar3 = itlib::
          flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
          ::find<char[10]>(changed_attributes,(char (*) [10])"maxlength");
  if (cVar3._M_current !=
      (changed_attributes->m_container).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pWVar2 = &((this->widget)._M_t.
               super___uniq_ptr_impl<Rml::WidgetTextInputMultiLine,_std::default_delete<Rml::WidgetTextInputMultiLine>_>
               ._M_t.
               super__Tuple_impl<0UL,_Rml::WidgetTextInputMultiLine_*,_std::default_delete<Rml::WidgetTextInputMultiLine>_>
               .super__Head_base<0UL,_Rml::WidgetTextInputMultiLine_*,_false>._M_head_impl)->
              super_WidgetTextInput;
    local_24 = -1;
    Variant::GetInto<int,_0>(&(cVar3._M_current)->second,&local_24);
    WidgetTextInput::SetMaxLength(pWVar2,local_24);
  }
  cVar3 = itlib::
          flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
          ::find<char[6]>(changed_attributes,(char (*) [6])0x2d5209);
  if (cVar3._M_current !=
      (changed_attributes->m_container).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pWVar2 = &((this->widget)._M_t.
               super___uniq_ptr_impl<Rml::WidgetTextInputMultiLine,_std::default_delete<Rml::WidgetTextInputMultiLine>_>
               ._M_t.
               super__Tuple_impl<0UL,_Rml::WidgetTextInputMultiLine_*,_std::default_delete<Rml::WidgetTextInputMultiLine>_>
               .super__Head_base<0UL,_Rml::WidgetTextInputMultiLine_*,_false>._M_head_impl)->
              super_WidgetTextInput;
    paVar1 = &local_68.field_2;
    local_68._M_string_length = 0;
    local_68.field_2._M_local_buf[0] = '\0';
    local_68._M_dataplus._M_p = (pointer)paVar1;
    Variant::
    GetInto<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&(cVar3._M_current)->second,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == paVar1) {
      local_48.field_2._8_8_ = local_68.field_2._8_8_;
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    }
    else {
      local_48._M_dataplus._M_p = local_68._M_dataplus._M_p;
    }
    local_48.field_2._M_allocated_capacity._1_7_ = local_68.field_2._M_allocated_capacity._1_7_;
    local_48.field_2._M_local_buf[0] = local_68.field_2._M_local_buf[0];
    local_48._M_string_length = local_68._M_string_length;
    local_68._M_string_length = 0;
    local_68.field_2._M_local_buf[0] = '\0';
    local_68._M_dataplus._M_p = (pointer)paVar1;
    WidgetTextInput::SetValue(pWVar2,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p,
                      CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                               local_68.field_2._M_local_buf[0]) + 1);
    }
  }
  return;
}

Assistant:

void ElementFormControlTextArea::OnAttributeChange(const ElementAttributes& changed_attributes)
{
	ElementFormControl::OnAttributeChange(changed_attributes);

	if (changed_attributes.find("wrap") != changed_attributes.end())
		SetWordWrapProperties();

	if (changed_attributes.find("rows") != changed_attributes.end() || changed_attributes.find("cols") != changed_attributes.end())
		DirtyLayout();

	auto it = changed_attributes.find("maxlength");
	if (it != changed_attributes.end())
		widget->SetMaxLength(it->second.Get(-1));

	it = changed_attributes.find("value");
	if (it != changed_attributes.end())
		widget->SetValue(it->second.Get<String>());
}